

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void __thiscall
swrenderer::FCoverageBuffer::InsertSpan(FCoverageBuffer *this,int listnum,int start,int stop)

{
  Span *pSVar1;
  Span *pSVar2;
  bool bVar3;
  Span *pSVar4;
  Span *span_1;
  Span *span;
  Span **span_p;
  int stop_local;
  int start_local;
  int listnum_local;
  FCoverageBuffer *this_local;
  
  if (this->NumLists <= (uint)listnum) {
    __assert_fail("unsigned(listnum) < NumLists",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_things.cpp"
                  ,0xc1f,"void swrenderer::FCoverageBuffer::InsertSpan(int, int, int)");
  }
  if (stop <= start) {
    __assert_fail("start < stop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_things.cpp"
                  ,0xc20,"void swrenderer::FCoverageBuffer::InsertSpan(int, int, int)");
  }
  span = (Span *)(this->Spans + listnum);
  if ((span->NextSpan != (Span *)0x0) && (span->NextSpan->Start <= stop)) {
    for (; span->NextSpan != (Span *)0x0; span = span->NextSpan) {
      if (start <= span->NextSpan->Stop) {
        if (start < span->NextSpan->Start) {
          if (stop < span->NextSpan->Start) break;
          span->NextSpan->Start = (short)start;
          if (stop <= span->NextSpan->Stop) goto LAB_00391021;
        }
        else if (stop <= span->NextSpan->Stop) {
          return;
        }
        pSVar4 = span->NextSpan;
        pSVar4->Stop = (short)stop;
        pSVar1 = span->NextSpan;
        while( true ) {
          bVar3 = false;
          if ((pSVar1->NextSpan != (Span *)0x0) && (bVar3 = false, pSVar1->NextSpan->Start <= stop))
          {
            bVar3 = pSVar1->NextSpan->Stop <= stop;
          }
          if (!bVar3) break;
          pSVar2 = pSVar1->NextSpan;
          pSVar1->NextSpan = pSVar2->NextSpan;
          pSVar2->NextSpan = this->FreeSpans;
          this->FreeSpans = pSVar2;
        }
        if ((pSVar1->NextSpan != (Span *)0x0) && (pSVar1->NextSpan->Start <= stop)) {
          pSVar4->Stop = pSVar1->NextSpan->Stop;
          pSVar4 = pSVar1->NextSpan;
          pSVar1->NextSpan = pSVar4->NextSpan;
          pSVar4->NextSpan = this->FreeSpans;
          this->FreeSpans = pSVar4;
        }
        goto LAB_00391021;
      }
    }
  }
  pSVar4 = AllocSpan(this);
  pSVar4->NextSpan = span->NextSpan;
  pSVar4->Start = (short)start;
  pSVar4->Stop = (short)stop;
  span->NextSpan = pSVar4;
LAB_00391021:
  span_1 = this->Spans[listnum];
  while( true ) {
    if (span_1 == (Span *)0x0) {
      return;
    }
    if (span_1->Stop <= span_1->Start) break;
    if ((span_1->NextSpan != (Span *)0x0) && (span_1->NextSpan->Start <= span_1->Stop)) {
      __assert_fail("span->Stop < span->NextSpan->Start",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_things.cpp"
                    ,0xc72,"void swrenderer::FCoverageBuffer::InsertSpan(int, int, int)");
    }
    span_1 = span_1->NextSpan;
  }
  __assert_fail("span->Start < span->Stop",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_things.cpp"
                ,0xc6f,"void swrenderer::FCoverageBuffer::InsertSpan(int, int, int)");
}

Assistant:

void FCoverageBuffer::InsertSpan(int listnum, int start, int stop)
{
	assert(unsigned(listnum) < NumLists);
	assert(start < stop);

	Span **span_p = &Spans[listnum];
	Span *span;

	if (*span_p == NULL || (*span_p)->Start > stop)
	{ // This list is empty or the first entry is after this one, so we can just insert the span.
		goto addspan;
	}

	// Insert the new span in order, merging with existing ones.
	while (*span_p != NULL)
	{
		if ((*span_p)->Stop < start)							// =====		(existing span)
		{ // Span ends before this one starts.					//		  ++++	(new span)
			span_p = &(*span_p)->NextSpan;
			continue;
		}

		// Does the new span overlap or abut the existing one?
		if ((*span_p)->Start <= start)
		{
			if ((*span_p)->Stop >= stop)						// =============
			{ // The existing span completely covers this one.	//     +++++
				return;
			}
extend:		// Extend the existing span with the new one.		// ======
			span = *span_p;										//     +++++++
			span->Stop = stop;									// (or)  +++++

			// Free up any spans we just covered up.
			span_p = &(*span_p)->NextSpan;
			while (*span_p != NULL && (*span_p)->Start <= stop && (*span_p)->Stop <= stop)
			{
				Span *span = *span_p;							// ======  ======
				*span_p = span->NextSpan;						//     +++++++++++++
				span->NextSpan = FreeSpans;
				FreeSpans = span;
			}
			if (*span_p != NULL && (*span_p)->Start <= stop)	// =======         ========
			{ // Our new span connects two existing spans.		//     ++++++++++++++
			  // They should all be collapsed into a single span.
				span->Stop = (*span_p)->Stop;
				span = *span_p;
				*span_p = span->NextSpan;
				span->NextSpan = FreeSpans;
				FreeSpans = span;
			}
			goto check;
		}
		else if ((*span_p)->Start <= stop)						//        =====
		{ // The new span extends the existing span from		//    ++++
		  // the beginning.										// (or) ++++
			(*span_p)->Start = start;
			if ((*span_p)->Stop < stop)
			{ // The new span also extends the existing span	//     ======
			  // at the bottom									// ++++++++++++++
				goto extend;
			}
			goto check;
		}
		else													//         ======
		{ // No overlap, so insert a new span.					// +++++
			goto addspan;
		}
	}
	// Append a new span to the end of the list.
addspan:
	span = AllocSpan();
	span->NextSpan = *span_p;
	span->Start = start;
	span->Stop = stop;
	*span_p = span;
check:
#ifdef _DEBUG
	// Validate the span list: Spans must be in order, and there must be
	// at least one pixel between spans.
	for (span = Spans[listnum]; span != NULL; span = span->NextSpan)
	{
		assert(span->Start < span->Stop);
		if (span->NextSpan != NULL)
		{
			assert(span->Stop < span->NextSpan->Start);
		}
	}
#endif
	;
}